

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O3

uint __thiscall
Kernel::Signature::addLinMul<Kernel::IntegerConstantType>
          (Signature *this,IntegerConstantType *number)

{
  Symbol ***pppSVar1;
  SymbolMap *this_00;
  Symbol **ppSVar2;
  Symbol **ppSVar3;
  undefined8 uVar4;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict6
  RVar5;
  LinMulSym<Kernel::IntegerConstantType> *this_01;
  TermList TVar6;
  OperatorKey *key_00;
  OperatorType *type;
  Symbol **ppSVar7;
  size_type extraout_RDX;
  uint uVar8;
  pair<Kernel::IntegerConstantType,_unsigned_int> *b;
  uint uVar9;
  initializer_list<Kernel::TermList> sorts;
  anon_class_16_2_d708292f f;
  SymbolKey key;
  anon_class_1_0_00000001 local_e9;
  undefined1 local_e8 [24];
  pair<Kernel::IntegerConstantType,_unsigned_int> local_d0;
  Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
  local_b4;
  Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
  local_88;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>_>
  local_5c;
  
  b = &local_d0;
  IntegerConstantType::IntegerConstantType(&b->first,number);
  local_d0.second = 1;
  Lib::
  Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
  ::Coproduct<std::pair<Kernel::IntegerConstantType,_unsigned_int>,_0>(&local_88,b);
  mpz_clear((__mpz_struct *)&local_d0);
  Lib::CoproductImpl::TrivialOperations::CopyCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>_>
  ::DefaultImpl(&local_5c,&local_88._inner);
  this_00 = &this->_funNames;
  Lib::
  Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
  ::tryGet((Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
            *)local_e8,
           (Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
            *)this_00);
  uVar4 = local_e8._0_8_;
  if ((OperatorKey *)local_e8._0_8_ != (OperatorKey *)0x0) {
    b = (pair<Kernel::IntegerConstantType,_unsigned_int> *)(ulong)*(uint *)local_e8._0_8_;
  }
  uVar8 = (uint)b;
  Lib::CoproductImpl::
  RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>>::~DefaultImpl()::_lambda(auto:1)_1_>
            ((RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
              *)&local_5c,(anon_class_8_1_8991fb9c)&local_5c);
  if ((OperatorKey *)uVar4 == (OperatorKey *)0x0) {
    this->_integers = this->_integers + 1;
    ppSVar2 = (this->_funs)._cursor;
    ppSVar3 = (this->_funs)._stack;
    this_01 = (LinMulSym<Kernel::IntegerConstantType> *)::operator_new(0x60);
    IntegerConstantType::IntegerConstantType((IntegerConstantType *)(local_e8 + 8),number);
    LinMulSym<Kernel::IntegerConstantType>::LinMulSym(this_01,(IntegerConstantType *)(local_e8 + 8))
    ;
    mpz_clear((__mpz_struct *)(local_e8 + 8));
    TVar6 = AtomicSort::intSort();
    sorts._M_len = extraout_RDX;
    sorts._M_array = (iterator)0x1;
    local_e8._0_8_ = TVar6;
    key_00 = OperatorType::setupKey((OperatorType *)local_e8,sorts);
    *(uint64_t *)(key_00 + 0x10) = TVar6._content;
    type = OperatorType::getTypeFromKey(key_00,0);
    Symbol::setType((Symbol *)this_01,type);
    ppSVar7 = (this->_funs)._cursor;
    if (ppSVar7 == (this->_funs)._end) {
      Lib::Stack<Kernel::Signature::Symbol_*>::expand(&this->_funs);
      ppSVar7 = (this->_funs)._cursor;
    }
    *ppSVar7 = (Symbol *)this_01;
    pppSVar1 = &(this->_funs)._cursor;
    *pppSVar1 = *pppSVar1 + 1;
    Lib::CoproductImpl::TrivialOperations::CopyCons::
    DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>_>
    ::DefaultImpl(&local_b4._inner,&local_88._inner);
    uVar8 = (uint)((ulong)((long)ppSVar2 - (long)ppSVar3) >> 3);
    local_e8._0_4_ = uVar8;
    if ((this->_funNames)._maxEntries <= (this->_funNames)._noOfEntries) {
      Lib::
      Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
      ::expand(this_00);
    }
    f.this = &local_b4;
    f.f = &local_e9;
    RVar5 = Lib::CoproductImpl::
            RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
            ::
            switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                      ((RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
                        *)&local_b4,f);
    uVar9 = (byte)local_b4._inner.
                  super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>_>
                  .
                  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>_>
                  .
                  super_RawCoproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>
                  ._0_1_ & 7;
    uVar9 = (uVar9 >> 2) + RVar5 + uVar9 * 0x40 + 0x9e3779b9 ^ uVar9;
    Lib::
    Map<Lib::Coproduct<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::IntegerConstantType,_unsigned_int>,_std::pair<Kernel::RationalConstantType,_unsigned_int>,_std::pair<Kernel::RealConstantType,_unsigned_int>,_std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>_>,_unsigned_int,_Lib::DefaultHash>
    ::insert(this_00,&local_b4,(uint *)local_e8,uVar9 + (uVar9 == 0));
    Lib::CoproductImpl::
    RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
    ::
    switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>>::~DefaultImpl()::_lambda(auto:1)_1_>
              ((RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
                *)&local_b4,(anon_class_8_1_8991fb9c)&local_b4);
  }
  Lib::CoproductImpl::
  RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>>::~DefaultImpl()::_lambda(auto:1)_1_>
            ((RawCoproduct<std::pair<std::__cxx11::string,unsigned_int>,std::__cxx11::string,std::pair<Kernel::IntegerConstantType,unsigned_int>,std::pair<Kernel::RationalConstantType,unsigned_int>,std::pair<Kernel::RealConstantType,unsigned_int>,std::pair<Kernel::Theory::Interpretation,Kernel::OperatorType*>>
              *)&local_88,(anon_class_8_1_8991fb9c)&local_88);
  return uVar8;
}

Assistant:

unsigned addLinMul(Numeral const& number) {
    auto key = SymbolKey(std::make_pair(number, unsigned(1)));
    unsigned result;
    if (_funNames.find(key, result)) {
      return result;
    }
    noteOccurrence(number);
    result = _funs.length();
    Symbol* sym = new LinMulSym<Numeral>(number);
    auto s = AnyLinMulSym::sortOf<Numeral>();
    sym->setType(OperatorType::getFunctionType({s}, s));
    _funs.push(sym);
    _funNames.insert(key,result);
    return result;
  }